

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sendf.c
# Opt level: O2

_Bool Curl_creader_needs_rewind(Curl_easy *data)

{
  Curl_creader *pCVar1;
  curl_trc_feat *pcVar2;
  _Bool _Var3;
  Curl_creader **ppCVar4;
  
  ppCVar4 = &(data->req).reader_stack;
  do {
    pCVar1 = *ppCVar4;
    if (pCVar1 == (Curl_creader *)0x0) goto LAB_001496b7;
    _Var3 = (*pCVar1->crt->needs_rewind)(data,pCVar1);
    ppCVar4 = &pCVar1->next;
  } while (!_Var3);
  if ((((data != (Curl_easy *)0x0) && (((data->set).field_0x8cd & 0x10) != 0)) &&
      ((pcVar2 = (data->state).feat, pcVar2 == (curl_trc_feat *)0x0 || (0 < pcVar2->log_level)))) &&
     (0 < Curl_trc_feat_read.log_level)) {
    Curl_trc_read(data,"client reader needs rewind before next request");
  }
LAB_001496b7:
  return pCVar1 != (Curl_creader *)0x0;
}

Assistant:

bool Curl_creader_needs_rewind(struct Curl_easy *data)
{
  struct Curl_creader *reader = data->req.reader_stack;
  while(reader) {
    if(reader->crt->needs_rewind(data, reader)) {
      CURL_TRC_READ(data, "client reader needs rewind before next request");
      return TRUE;
    }
    reader = reader->next;
  }
  return FALSE;
}